

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

void __thiscall icu_63::FixedDecimal::FixedDecimal(FixedDecimal *this,double n,int32_t v,int64_t f)

{
  undefined4 in_register_00000034;
  
  (this->super_IFixedDecimal)._vptr_IFixedDecimal = (_func_int **)&PTR__FixedDecimal_003f27f0;
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__FixedDecimal_003f2830;
  init(this,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,v));
  return;
}

Assistant:

FixedDecimal::FixedDecimal(double n, int32_t v, int64_t f) {
    init(n, v, f);
    // check values. TODO make into unit test.
    //            
    //            long visiblePower = (int) Math.pow(10, v);
    //            if (decimalDigits > visiblePower) {
    //                throw new IllegalArgumentException();
    //            }
    //            double fraction = intValue + (decimalDigits / (double) visiblePower);
    //            if (fraction != source) {
    //                double diff = Math.abs(fraction - source)/(Math.abs(fraction) + Math.abs(source));
    //                if (diff > 0.00000001d) {
    //                    throw new IllegalArgumentException();
    //                }
    //            }
}